

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O3

int emitJump(uint8_t instruction)

{
  writeChunk(&current->function->chunk,instruction,parser.previous.line);
  writeChunk(&current->function->chunk,0xff,parser.previous.line);
  writeChunk(&current->function->chunk,0xff,parser.previous.line);
  return (current->function->chunk).count + -2;
}

Assistant:

static int emitJump(uint8_t instruction) {
    emitByte(instruction);
    emitByte(0xff);
    emitByte(0xff);
    return currentChunk()->count - 2;
}